

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.hpp
# Opt level: O2

void __thiscall
ableton::link::
Measurement<ableton::platforms::asio::AsioService,ableton::platforms::linux::Clock<1>,ableton::discovery::Socket<512ul>,ableton::util::NullLog>
::Impl::
sendPing<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>>
          (Impl *this,endpoint *to,
          Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
          *payload)

{
  uchar *puVar1;
  int in_R8D;
  MessageBuffer buffer;
  
  puVar1 = v1::
           pingMessage<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                     (payload,buffer._M_elems);
  discovery::Socket<512UL>::send
            (*(Socket<512UL> **)(this + 0x10),(int)&buffer,puVar1 + -(long)&buffer,(size_t)to,in_R8D
            );
  return;
}

Assistant:

void sendPing(asio::ip::udp::endpoint to, const Payload& payload)
    {
      v1::MessageBuffer buffer;
      const auto msgBegin = std::begin(buffer);
      const auto msgEnd = v1::pingMessage(payload, msgBegin);
      const auto numBytes = static_cast<size_t>(std::distance(msgBegin, msgEnd));

      try
      {
        mpSocket->send(buffer.data(), numBytes, to);
      }
      catch (const std::runtime_error& err)
      {
        info(*mLog) << "Failed to send Ping to " << to.address().to_string() << ": "
                    << err.what();
      }
    }